

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O1

void __thiscall llama_mmap::impl::impl(impl *this,llama_file *file,size_t prefetch,bool numa)

{
  _Head_base<0UL,_llama_file::impl_*,_false> _Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  void *__addr;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  ulong __len;
  int local_54;
  string local_50;
  
  (this->mapped_fragments).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mapped_fragments).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mapped_fragments).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var1._M_head_impl =
       (file->pimpl)._M_t.
       super___uniq_ptr_impl<llama_file::impl,_std::default_delete<llama_file::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_file::impl_*,_std::default_delete<llama_file::impl>_>.
       super__Head_base<0UL,_llama_file::impl_*,_false>._M_head_impl;
  this->size = (_Var1._M_head_impl)->size;
  iVar2 = fileno((FILE *)(_Var1._M_head_impl)->fp);
  if ((int)CONCAT71(in_register_00000009,numa) != 0) {
    prefetch = 0;
  }
  iVar3 = posix_fadvise(iVar2,0,0,2);
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "warning: posix_fadvise(.., POSIX_FADV_SEQUENTIAL) failed: %s\n",pcVar5);
  }
  __addr = mmap((void *)0x0,
                ((file->pimpl)._M_t.
                 super___uniq_ptr_impl<llama_file::impl,_std::default_delete<llama_file::impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_llama_file::impl_*,_std::default_delete<llama_file::impl>_>.
                 super__Head_base<0UL,_llama_file::impl_*,_false>._M_head_impl)->size,1,
                (uint)(prefetch != 0) * 0x8000 + 1,iVar2,0);
  this->addr = __addr;
  if (__addr != (void *)0xffffffffffffffff) {
    if (prefetch != 0) {
      __len = ((file->pimpl)._M_t.
               super___uniq_ptr_impl<llama_file::impl,_std::default_delete<llama_file::impl>_>._M_t.
               super__Tuple_impl<0UL,_llama_file::impl_*,_std::default_delete<llama_file::impl>_>.
               super__Head_base<0UL,_llama_file::impl_*,_false>._M_head_impl)->size;
      if (prefetch < __len) {
        __len = prefetch;
      }
      iVar2 = posix_madvise(__addr,__len,3);
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "warning: posix_madvise(.., POSIX_MADV_WILLNEED) failed: %s\n",pcVar5);
      }
    }
    if (numa) {
      iVar2 = posix_madvise(this->addr,
                            ((file->pimpl)._M_t.
                             super___uniq_ptr_impl<llama_file::impl,_std::default_delete<llama_file::impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llama_file::impl_*,_std::default_delete<llama_file::impl>_>
                             .super__Head_base<0UL,_llama_file::impl_*,_false>._M_head_impl)->size,1
                           );
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "warning: posix_madvise(.., POSIX_MADV_RANDOM) failed: %s\n",pcVar5);
      }
    }
    local_54 = 0;
    local_50._M_dataplus._M_p =
         (pointer)((file->pimpl)._M_t.
                   super___uniq_ptr_impl<llama_file::impl,_std::default_delete<llama_file::impl>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_llama_file::impl_*,_std::default_delete<llama_file::impl>_>
                   .super__Head_base<0UL,_llama_file::impl_*,_false>._M_head_impl)->size;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<int,unsigned_long>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)this,&local_54,(unsigned_long *)&local_50);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  format_abi_cxx11_(&local_50,"mmap failed: %s",pcVar5);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

impl(struct llama_file * file, size_t prefetch, bool numa) {
        size = file->size();
        int fd = file->file_id();
        int flags = MAP_SHARED;
        if (numa) { prefetch = 0; }
#ifdef __linux__
        if (posix_fadvise(fd, 0, 0, POSIX_FADV_SEQUENTIAL)) {
            LLAMA_LOG_WARN("warning: posix_fadvise(.., POSIX_FADV_SEQUENTIAL) failed: %s\n",
                    strerror(errno));
        }
        if (prefetch) { flags |= MAP_POPULATE; }
#endif
        addr = mmap(NULL, file->size(), PROT_READ, flags, fd, 0);
        if (addr == MAP_FAILED) {
            throw std::runtime_error(format("mmap failed: %s", strerror(errno)));
        }

        if (prefetch > 0) {
            if (posix_madvise(addr, std::min(file->size(), prefetch), POSIX_MADV_WILLNEED)) {
                LLAMA_LOG_WARN("warning: posix_madvise(.., POSIX_MADV_WILLNEED) failed: %s\n",
                        strerror(errno));
            }
        }
        if (numa) {
            if (posix_madvise(addr, file->size(), POSIX_MADV_RANDOM)) {
                LLAMA_LOG_WARN("warning: posix_madvise(.., POSIX_MADV_RANDOM) failed: %s\n",
                        strerror(errno));
            }
        }

        mapped_fragments.emplace_back(0, file->size());
    }